

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zBuf.c
# Opt level: O0

int Buf_Create(CBuf *p,size_t size,ISzAlloc *alloc)

{
  long lVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  int local_4;
  
  in_RDI[1] = 0;
  if (in_RSI == 0) {
    *in_RDI = 0;
    local_4 = 1;
  }
  else {
    lVar1 = (*(code *)*in_RDX)(in_RDX,in_RSI);
    *in_RDI = lVar1;
    if (*in_RDI == 0) {
      local_4 = 0;
    }
    else {
      in_RDI[1] = in_RSI;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Buf_Create(CBuf *p, size_t size, ISzAlloc *alloc)
{
  p->size = 0;
  if (size == 0)
  {
    p->data = 0;
    return 1;
  }
  p->data = (Byte *)alloc->Alloc(alloc, size);
  if (p->data != 0)
  {
    p->size = size;
    return 1;
  }
  return 0;
}